

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_output_chain.c
# Opt level: O0

ngx_int_t ngx_output_chain_add_copy(ngx_pool_t *pool,ngx_chain_t **chain,ngx_chain_t *in)

{
  ngx_buf_t *__src;
  ngx_chain_t *pnVar1;
  ngx_buf_t *__dest;
  ngx_buf_t *buf;
  ngx_buf_t *b;
  ngx_chain_t **ll;
  ngx_chain_t *cl;
  ngx_chain_t *in_local;
  ngx_chain_t **chain_local;
  ngx_pool_t *pool_local;
  
  b = (ngx_buf_t *)chain;
  for (ll = (ngx_chain_t **)*chain; cl = in, ll != (ngx_chain_t **)0x0; ll = (ngx_chain_t **)ll[1])
  {
    b = (ngx_buf_t *)(ll + 1);
  }
  while( true ) {
    if (cl == (ngx_chain_t *)0x0) {
      return 0;
    }
    pnVar1 = ngx_alloc_chain_link(pool);
    if (pnVar1 == (ngx_chain_t *)0x0) break;
    __src = cl->buf;
    if ((((*(ushort *)&__src->field_0x48 >> 4 & 1) == 0) || (0x7fffffff < __src->file_pos)) ||
       (__src->file_last < 0x80000001)) {
      pnVar1->buf = __src;
      cl = cl->next;
    }
    else {
      __dest = (ngx_buf_t *)ngx_pcalloc(pool,0x50);
      if (__dest == (ngx_buf_t *)0x0) {
        return -1;
      }
      memcpy(__dest,__src,0x50);
      if ((((*(ushort *)&__src->field_0x48 & 1) != 0) ||
          ((*(ushort *)&__src->field_0x48 >> 1 & 1) != 0)) ||
         ((*(ushort *)&__src->field_0x48 >> 2 & 1) != 0)) {
        __src->pos = __src->pos + (0x80000000 - __src->file_pos);
        __dest->last = __src->pos;
      }
      __src->file_pos = 0x80000000;
      __dest->file_last = 0x80000000;
      pnVar1->buf = __dest;
    }
    pnVar1->next = (ngx_chain_t *)0x0;
    b->pos = (u_char *)pnVar1;
    b = (ngx_buf_t *)&pnVar1->next;
  }
  return -1;
}

Assistant:

static ngx_int_t
ngx_output_chain_add_copy(ngx_pool_t *pool, ngx_chain_t **chain,
    ngx_chain_t *in)
{
    ngx_chain_t  *cl, **ll;
#if (NGX_SENDFILE_LIMIT)
    ngx_buf_t    *b, *buf;
#endif

    ll = chain;

    for (cl = *chain; cl; cl = cl->next) {
        ll = &cl->next;
    }

    while (in) {

        cl = ngx_alloc_chain_link(pool);
        if (cl == NULL) {
            return NGX_ERROR;
        }

#if (NGX_SENDFILE_LIMIT)

        buf = in->buf;

        if (buf->in_file
            && buf->file_pos < NGX_SENDFILE_LIMIT
            && buf->file_last > NGX_SENDFILE_LIMIT)
        {
            /* split a file buf on two bufs by the sendfile limit */

            b = ngx_calloc_buf(pool);
            if (b == NULL) {
                return NGX_ERROR;
            }

            ngx_memcpy(b, buf, sizeof(ngx_buf_t));

            if (ngx_buf_in_memory(buf)) {
                buf->pos += (ssize_t) (NGX_SENDFILE_LIMIT - buf->file_pos);
                b->last = buf->pos;
            }

            buf->file_pos = NGX_SENDFILE_LIMIT;
            b->file_last = NGX_SENDFILE_LIMIT;

            cl->buf = b;

        } else {
            cl->buf = buf;
            in = in->next;
        }

#else
        cl->buf = in->buf;
        in = in->next;

#endif

        cl->next = NULL;
        *ll = cl;
        ll = &cl->next;
    }

    return NGX_OK;
}